

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

optional<CKey> * __thiscall
wallet::CWallet::GetKey(optional<CKey> *__return_storage_ptr__,CWallet *this,CKeyID *keyid)

{
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  unique_lock<std::recursive_mutex> uStack_78;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl._0_1_ =
       (byte)((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22) & 1;
  inline_assertion_check<true,bool>
            ((bool *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x11fe,"GetKey","IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)");
  GetAllScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_68,this);
  p_Var1 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var1 == &local_68._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_68);
      (__return_storage_ptr__->super__Optional_base<CKey,_false,_false>)._M_payload.
      super__Optional_payload<CKey,_true,_false,_false>.super__Optional_payload_base<CKey>.
      _M_engaged = false;
LAB_0047685d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if (*(long *)(p_Var1 + 1) == 0) {
LAB_0047687f:
      __assert_fail("desc_spkm",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x1202,"std::optional<CKey> wallet::CWallet::GetKey(const CKeyID &) const");
    }
    this_00 = (DescriptorScriptPubKeyMan *)
              __dynamic_cast(*(long *)(p_Var1 + 1),&ScriptPubKeyMan::typeinfo,
                             &DescriptorScriptPubKeyMan::typeinfo,0);
    if (this_00 == (DescriptorScriptPubKeyMan *)0x0) goto LAB_0047687f;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_78,&this_00->cs_desc_man
               ,"desc_spkm->cs_desc_man",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0x1203,false);
    DescriptorScriptPubKeyMan::GetKey(__return_storage_ptr__,this_00,keyid);
    if ((__return_storage_ptr__->super__Optional_base<CKey,_false,_false>)._M_payload.
        super__Optional_payload<CKey,_true,_false,_false>.super__Optional_payload_base<CKey>.
        _M_engaged != false) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_78);
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_68);
      goto LAB_0047685d;
    }
    std::_Optional_payload_base<CKey>::_M_reset
              ((_Optional_payload_base<CKey> *)__return_storage_ptr__);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_78);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
  } while( true );
}

Assistant:

std::optional<CKey> CWallet::GetKey(const CKeyID& keyid) const
{
    Assert(IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    for (const auto& spkm : GetAllScriptPubKeyMans()) {
        const DescriptorScriptPubKeyMan* desc_spkm = dynamic_cast<DescriptorScriptPubKeyMan*>(spkm);
        assert(desc_spkm);
        LOCK(desc_spkm->cs_desc_man);
        if (std::optional<CKey> key = desc_spkm->GetKey(keyid)) {
            return key;
        }
    }
    return std::nullopt;
}